

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O1

int sha3_shake_done(hash_state *md,uchar *out,unsigned_long outlen)

{
  ulong *puVar1;
  ushort uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  
  if (outlen != 0) {
    if (md == (hash_state *)0x0) {
      sha3_shake_done_cold_1();
    }
    if (out == (uchar *)0x0) {
      sha3_shake_done_cold_2();
    }
    if ((md->sha3).xof_flag == 0) {
      *(ulong *)((long)md + (ulong)(md->sha3).word_index * 8 + 8) =
           *(ulong *)((long)md + (ulong)(md->sha3).word_index * 8 + 8) ^ (md->chc).length ^
           0x1fL << ((ulong)(byte)(md->dummy[0x198] << 3) & 0x3f);
      puVar1 = (ulong *)((long)md + (0x18 - (ulong)(md->sha3).capacity_words) * 8 + 8);
      *puVar1 = *puVar1 ^ 0x8000000000000000;
      keccakf((md->whirlpool).state);
      lVar5 = 0;
      auVar6 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar7 = vpbroadcastq_avx512f(ZEXT816(0x19));
      do {
        auVar8 = vpbroadcastq_avx512f();
        auVar8 = vporq_avx512f(auVar8,auVar6);
        uVar3 = vpcmpuq_avx512f(auVar8,auVar7,1);
        auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)md + lVar5 * 8 + 8));
        auVar9._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar8._8_8_;
        auVar9._0_8_ = (ulong)((byte)uVar3 & 1) * auVar8._0_8_;
        auVar9._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar8._16_8_;
        auVar9._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar8._24_8_;
        auVar9._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar8._32_8_;
        auVar9._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar8._40_8_;
        auVar9._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar8._48_8_;
        auVar9._56_8_ = (uVar3 >> 7) * auVar8._56_8_;
        auVar8 = vmovdqu64_avx512f(auVar9);
        *(undefined1 (*) [64])((long)md + lVar5 * 8 + 0xd0) = auVar8;
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x20);
      (md->sha3).byte_index = 0;
      (md->sha3).xof_flag = 1;
    }
    lVar5 = 0;
    do {
      if ((int)((uint)(md->sha3).capacity_words * -8 + 200) <= (int)(uint)(md->sha3).byte_index) {
        keccakf((md->whirlpool).state);
        auVar6 = vpbroadcastq_avx512f(ZEXT816(0x19));
        auVar7 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        lVar4 = 0;
        do {
          auVar8 = vpbroadcastq_avx512f();
          auVar8 = vporq_avx512f(auVar8,auVar7);
          uVar3 = vpcmpuq_avx512f(auVar8,auVar6,1);
          auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)md + lVar4 * 8 + 8));
          auVar10._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar8._8_8_;
          auVar10._0_8_ = (ulong)((byte)uVar3 & 1) * auVar8._0_8_;
          auVar10._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar8._16_8_;
          auVar10._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar8._24_8_;
          auVar10._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar8._32_8_;
          auVar10._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar8._40_8_;
          auVar10._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar8._48_8_;
          auVar10._56_8_ = (uVar3 >> 7) * auVar8._56_8_;
          auVar8 = vmovdqu64_avx512f(auVar10);
          *(undefined1 (*) [64])((long)md + lVar4 * 8 + 0xd0) = auVar8;
          lVar4 = lVar4 + 8;
        } while (lVar4 != 0x20);
        (md->sha3).byte_index = 0;
      }
      uVar2 = (md->sha3).byte_index;
      (md->sha3).byte_index = uVar2 + 1;
      out[lVar5] = md->dummy[(ulong)uVar2 + 0xd0];
      lVar5 = lVar5 + 1;
    } while (lVar5 != outlen + (outlen == 0));
  }
  return 0;
}

Assistant:

int sha3_shake_done(hash_state *md, unsigned char *out, unsigned long outlen)
{
   /* IMPORTANT NOTE: sha3_shake_done can be called many times */
   unsigned long idx;
   unsigned i;

   if (outlen == 0) return CRYPT_OK; /* nothing to do */
   LTC_ARGCHK(md  != NULL);
   LTC_ARGCHK(out != NULL);

   if (!md->sha3.xof_flag) {
      /* shake_xof operation must be done only once */
      md->sha3.s[md->sha3.word_index] ^= (md->sha3.saved ^ (CONST64(0x1F) << (md->sha3.byte_index * 8)));
      md->sha3.s[SHA3_KECCAK_SPONGE_WORDS - md->sha3.capacity_words - 1] ^= CONST64(0x8000000000000000);
      keccakf(md->sha3.s);
      /* store sha3.s[] as little-endian bytes into sha3.sb */
      for(i = 0; i < SHA3_KECCAK_SPONGE_WORDS; i++) {
         STORE64L(md->sha3.s[i], md->sha3.sb + i * 8);
      }
      md->sha3.byte_index = 0;
      md->sha3.xof_flag = 1;
   }

   for (idx = 0; idx < outlen; idx++) {
      if(md->sha3.byte_index >= (SHA3_KECCAK_SPONGE_WORDS - md->sha3.capacity_words) * 8) {
         keccakf(md->sha3.s);
         /* store sha3.s[] as little-endian bytes into sha3.sb */
         for(i = 0; i < SHA3_KECCAK_SPONGE_WORDS; i++) {
            STORE64L(md->sha3.s[i], md->sha3.sb + i * 8);
         }
         md->sha3.byte_index = 0;
      }
      out[idx] = md->sha3.sb[md->sha3.byte_index++];
   }
   return CRYPT_OK;
}